

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

bool ft::
     equal<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>>
               (constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                *first1,constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                        *last1,
               constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
               *first2,type *param_4,type *param_5)

{
  bool bVar1;
  
  bVar1 = equal<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::equal_to<ft::pair<int_const,int>>>
                    ();
  return bVar1;
}

Assistant:

bool equal(Iterator1 first1, Iterator1 last1, Iterator2 first2,
		   typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
		   typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	return ft::equal(first1, last1, first2, ft::equal_to<typename ft::iterator_traits<Iterator1>::value_type>());
}